

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

void __thiscall llvm::APFloat::APFloat(APFloat *this,DoubleAPFloat *F,fltSemantics *S)

{
  DoubleAPFloat DStack_28;
  
  detail::DoubleAPFloat::DoubleAPFloat(&DStack_28,F);
  Storage::Storage((Storage *)&(this->U).IEEE,&DStack_28,S);
  std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
            (&DStack_28.Floats);
  return;
}

Assistant:

explicit APFloat(DoubleAPFloat F, const fltSemantics &S)
      : U(std::move(F), S) {}